

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (long begin,long end,undefined1 param_3,comm *param_4)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  T sum;
  comm nonzero_comm;
  undefined4 local_4c;
  comm local_48;
  
  comm::split(&local_48,param_4,(uint)(end - begin != 0));
  if (end - begin != 0) {
    local_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (begin,end);
    local_4c = *(undefined4 *)(begin + -4 + (end - begin));
    iVar2 = exscan<int,std::plus<int>>(&local_4c,&local_48,param_3);
    if (local_48.m_rank != 0) {
      for (lVar3 = 0; end - begin >> 2 != lVar3; lVar3 = lVar3 + 1) {
        piVar1 = (int *)(begin + lVar3 * 4);
        *piVar1 = *piVar1 + iVar2;
      }
    }
  }
  comm::~comm(&local_48);
  return;
}

Assistant:

inline void global_scan_inplace(Iterator begin, Iterator end, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    Iterator o = begin;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local inplace scan
        local_scan_inplace(begin, end, func);
        // mxx::exscan
        typedef typename std::iterator_traits<Iterator>::value_type T;
        T sum = *(begin + (n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);

        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}